

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_tpl_varnames_h.cc
# Opt level: O0

string * Boilerplate(string *progname,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *filenames)

{
  ulong uVar1;
  size_type sVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  string local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  ulong local_40;
  size_type i;
  allocator local_22;
  undefined1 local_21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filenames_local;
  string *progname_local;
  string *out;
  
  local_21 = 0;
  local_20 = in_RDX;
  filenames_local = filenames;
  progname_local = progname;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)progname,"//\n",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_20);
  if (sVar2 < 2) {
    std::__cxx11::string::append((char *)progname);
  }
  else {
    std::__cxx11::string::append((char *)progname);
  }
  for (local_40 = 0; uVar1 = local_40,
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_20), uVar1 < sVar2; local_40 = local_40 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_20,local_40);
    std::operator+((char *)local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"//    ");
    std::operator+(local_60,(char *)local_80);
    std::__cxx11::string::append((string *)progname);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string(local_80);
  }
  std::operator+((char *)local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"// by ");
  std::operator+(local_e0,(char *)local_100);
  std::operator+(local_c0,(char *)local_e0);
  std::operator+(local_a0,(char *)local_c0);
  std::__cxx11::string::append((string *)progname);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string(local_100);
  return progname;
}

Assistant:

static string Boilerplate(const string& progname,
                          const vector<string>& filenames) {
  string out(string("//\n"));
  if (filenames.size() > 1)
    out.append("// This header file auto-generated for the templates\n");
  else
    out.append("// This header file auto-generated for the template\n");

  for (vector<string>::size_type i = 0; i < filenames.size(); ++i)
    out.append("//    " + filenames[i] + "\n");

  out.append("// by " + progname + "\n" +
             "// DO NOT MODIFY THIS FILE DIRECTLY\n" +
             "//\n");
  return out;
}